

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O0

int xmrig::NvmlLib::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined7 extraout_var;
  undefined7 uVar3;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  if ((m_initialized & 1) == 0) {
    String::operator=((String *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                      in_stack_ffffffffffffffe8);
    bVar1 = dlopen();
    uVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      bVar2 = load();
      uVar3 = extraout_var;
    }
    m_ready = bVar2;
    in_RAX = CONCAT71(uVar3,m_ready);
    m_initialized = 1;
  }
  return (uint)CONCAT71((int7)((ulong)in_RAX >> 8),m_ready) & 0xffffff01;
}

Assistant:

bool xmrig::NvmlLib::init(const char *fileName)
{
    if (!m_initialized) {
        m_loader      = fileName;
        m_ready       = dlopen() && load();
        m_initialized = true;
    }

    return m_ready;
}